

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_construct_local_link
              (mg_connection *conn,char *buf,size_t buflen,char *define_proto,int define_port,
              char *define_uri)

{
  short sVar1;
  int iVar2;
  size_t sVar3;
  size_t a;
  char *dst;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  uint local_104;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char local_e8 [8];
  char server_ip [48];
  char portstr [16];
  char *local_a0;
  char *server_domain;
  int auth_domain_check_enabled;
  int is_ipv6;
  size_t uri_encoded_len;
  char *uri_encoded;
  int default_port;
  int port;
  char *uri;
  char *proto;
  mg_request_info *ri;
  int local_58;
  int truncated;
  int j;
  int i;
  char *define_uri_local;
  char *pcStack_40;
  int define_port_local;
  char *define_proto_local;
  size_t buflen_local;
  char *buf_local;
  mg_connection *conn_local;
  
  if (((buflen == 0) || (buf == (char *)0x0)) || (conn == (mg_connection *)0x0)) {
    conn_local._4_4_ = -1;
  }
  else {
    ri._4_4_ = 0;
    local_f0 = define_proto;
    _j = define_uri;
    define_uri_local._4_4_ = define_port;
    pcStack_40 = define_proto;
    define_proto_local = (char *)buflen;
    buflen_local = (size_t)buf;
    buf_local = (char *)conn;
    if (define_proto == (char *)0x0) {
      local_f0 = get_proto_name(conn);
    }
    if (_j == (char *)0x0) {
      if ((conn->request_info).request_uri == (char *)0x0) {
        local_100 = (conn->request_info).local_uri;
      }
      else {
        local_100 = (conn->request_info).request_uri;
      }
      local_f8 = local_100;
    }
    else {
      local_f8 = _j;
    }
    if ((int)define_uri_local._4_4_ < 1) {
      local_104 = (conn->request_info).server_port;
    }
    else {
      local_104 = define_uri_local._4_4_;
    }
    uri_encoded._0_4_ = 0x50;
    if (local_f8 == (char *)0x0) {
      conn_local._4_4_ = -1;
    }
    else {
      sVar3 = strlen(local_f8);
      a = sVar3 * 3 + 1;
      dst = (char *)mg_malloc(a);
      if (dst == (char *)0x0) {
        conn_local._4_4_ = -1;
      }
      else {
        mg_url_encode(local_f8,dst,a);
        local_58 = 0;
        truncated = 0;
        while (dst[truncated] != '\0') {
          iVar2 = strncmp(dst + truncated,"%2f",3);
          if (iVar2 == 0) {
            dst[local_58] = '/';
            truncated = truncated + 3;
          }
          else {
            dst[local_58] = dst[truncated];
            truncated = truncated + 1;
          }
          local_58 = local_58 + 1;
        }
        dst[local_58] = '\0';
        if (pcStack_40 == (char *)0x0) {
          if ((conn->request_info).is_ssl != 0) {
            uri_encoded._0_4_ = 0x1bb;
          }
        }
        else {
          iVar2 = strcmp(pcStack_40,"https");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_40,"wss"), iVar2 == 0)) {
            uri_encoded._0_4_ = 0x1bb;
          }
        }
        sVar1 = *(short *)(buf_local + 0x8fc);
        bVar6 = false;
        if (*(long *)(*(long *)(buf_local + 0x8e8) + 0x100) != 0) {
          iVar2 = mg_strcasecmp(*(char **)(*(long *)(buf_local + 0x8e8) + 0x100),"yes");
          bVar6 = iVar2 == 0;
        }
        local_a0 = *(char **)(*(long *)(buf_local + 0x8e8) + 0xf8);
        if (local_104 == (uint)uri_encoded) {
          server_ip[0x28] = '\0';
        }
        else {
          sprintf(server_ip + 0x28,":%u",(ulong)local_104);
        }
        if ((!bVar6) || (local_a0 == (char *)0x0)) {
          sockaddr_to_string(local_e8,0x30,(usa *)(buf_local + 0x8fc));
          local_a0 = local_e8;
        }
        pcVar4 = "";
        if (sVar1 == 10 && local_a0 == local_e8) {
          pcVar4 = "[";
        }
        pcVar5 = "";
        if (sVar1 == 10 && local_a0 == local_e8) {
          pcVar5 = "]";
        }
        mg_snprintf((mg_connection *)buf_local,(int *)((long)&ri + 4),(char *)buflen_local,
                    (size_t)define_proto_local,"%s://%s%s%s%s%s",local_f0,pcVar4,local_a0,pcVar5,
                    server_ip + 0x28,dst);
        mg_free(dst);
        if (ri._4_4_ == 0) {
          conn_local._4_4_ = 0;
        }
        else {
          conn_local._4_4_ = -1;
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
mg_construct_local_link(const struct mg_connection *conn,
                        char *buf,
                        size_t buflen,
                        const char *define_proto,
                        int define_port,
                        const char *define_uri)
{
	if ((buflen < 1) || (buf == 0) || (conn == 0)) {
		return -1;
	} else {
		int i, j;
		int truncated = 0;
		const struct mg_request_info *ri = &conn->request_info;

		const char *proto =
		    (define_proto != NULL) ? define_proto : get_proto_name(conn);
		const char *uri =
		    (define_uri != NULL)
		        ? define_uri
		        : ((ri->request_uri != NULL) ? ri->request_uri : ri->local_uri);
		int port = (define_port > 0) ? define_port : ri->server_port;
		int default_port = 80;
		char *uri_encoded;
		size_t uri_encoded_len;

		if (uri == NULL) {
			return -1;
		}

		uri_encoded_len = strlen(uri) * 3 + 1;
		uri_encoded = (char *)mg_malloc_ctx(uri_encoded_len, conn->phys_ctx);
		if (uri_encoded == NULL) {
			return -1;
		}
		mg_url_encode(uri, uri_encoded, uri_encoded_len);

		/* Directory separator should be preserved. */
		for (i = j = 0; uri_encoded[i]; j++) {
			if (!strncmp(uri_encoded + i, "%2f", 3)) {
				uri_encoded[j] = '/';
				i += 3;
			} else {
				uri_encoded[j] = uri_encoded[i++];
			}
		}
		uri_encoded[j] = '\0';

#if defined(USE_X_DOM_SOCKET)
		if (conn->client.lsa.sa.sa_family == AF_UNIX) {
			/* TODO: Define and document a link for UNIX domain sockets. */
			/* There seems to be no official standard for this.
			 * Common uses seem to be "httpunix://", "http.unix://" or
			 * "http+unix://" as a protocol definition string, followed by
			 * "localhost" or "127.0.0.1" or "/tmp/unix/path" or
			 * "%2Ftmp%2Funix%2Fpath" (url % encoded) or
			 * "localhost:%2Ftmp%2Funix%2Fpath" (domain socket path as port) or
			 * "" (completely skipping the server name part). In any case, the
			 * last part is the server local path. */
			const char *server_name = UNIX_DOMAIN_SOCKET_SERVER_NAME;
			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
			            "%s.unix://%s%s",
			            proto,
			            server_name,
			            ri->local_uri);
			default_port = 0;
			mg_free(uri_encoded);
			return 0;
		}
#endif

		if (define_proto) {
			/* If we got a protocol name, use the default port accordingly. */
			if ((0 == strcmp(define_proto, "https"))
			    || (0 == strcmp(define_proto, "wss"))) {
				default_port = 443;
			}
		} else if (ri->is_ssl) {
			/* If we did not get a protocol name, use TLS as default if it is
			 * already used. */
			default_port = 443;
		}

		{
#if defined(USE_IPV6)
			int is_ipv6 = (conn->client.lsa.sa.sa_family == AF_INET6);
#endif
			int auth_domain_check_enabled =
			    conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK]
			    && (!mg_strcasecmp(
			           conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK], "yes"));

			const char *server_domain =
			    conn->dom_ctx->config[AUTHENTICATION_DOMAIN];

			char portstr[16];
			char server_ip[48];

			if (port != default_port) {
				sprintf(portstr, ":%u", (unsigned)port);
			} else {
				portstr[0] = 0;
			}

			if (!auth_domain_check_enabled || !server_domain) {

				sockaddr_to_string(server_ip,
				                   sizeof(server_ip),
				                   &conn->client.lsa);

				server_domain = server_ip;
			}

			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
#if defined(USE_IPV6)
			            "%s://%s%s%s%s%s",
			            proto,
			            (is_ipv6 && (server_domain == server_ip)) ? "[" : "",
			            server_domain,
			            (is_ipv6 && (server_domain == server_ip)) ? "]" : "",
#else
			            "%s://%s%s%s",
			            proto,
			            server_domain,
#endif
			            portstr,
			            uri_encoded);

			mg_free(uri_encoded);
			if (truncated) {
				return -1;
			}
			return 0;
		}
	}
}